

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_function.hpp
# Opt level: O0

vector __thiscall
sisl::basis_function::grad_convolution_sum_h<3,sisl::cartesian_cubic<float>,sisl::tp_linear>
          (basis_function *this,vector *p,cartesian_cubic<float> *base,
          cartesian_cubic<float> **lattices,double *h)

{
  Index *this_00;
  float fVar1;
  cartesian_cubic<float> *pcVar2;
  bool bVar3;
  int iVar4;
  reference other;
  undefined4 extraout_var;
  Scalar *pSVar5;
  Index extraout_RDX;
  double dVar6;
  vector vVar7;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_1c0;
  Matrix<int,__1,_1,_0,__1,_1> local_1a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_198;
  Matrix<int,__1,_1,_0,__1,_1> local_180;
  int local_16c;
  undefined1 local_168 [4];
  int j;
  Type local_150;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
  local_128;
  vector local_f0;
  double local_e0;
  double w;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
  local_d0;
  Matrix<int,__1,_1,_0,__1,_1> local_b8;
  undefined1 local_a8 [8];
  lattice_site s;
  iterator __end0;
  iterator __begin0;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  *__range2;
  undefined1 local_78 [8];
  lattice_site extent;
  undefined1 local_58 [8];
  lattice_site c;
  vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
  sites;
  double *h_local;
  cartesian_cubic<float> **lattices_local;
  cartesian_cubic<float> *base_local;
  vector *p_local;
  vector *value;
  
  tp_linear::get_integer_support<3>();
  (*(base->super_base_lattice<float>)._vptr_base_lattice[0xe])(local_58,base,p);
  (*(base->super_base_lattice<float>)._vptr_base_lattice[10])(local_78);
  __range2._7_1_ = 0;
  __range2._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,(int *)&__range2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  this_00 = &c.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  __end0 = std::
           vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
           ::begin((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                    *)this_00);
  s.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)std::
              vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
              ::end((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                     *)this_00);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_*,_std::vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                                     *)&s.
                                        super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                        m_storage.m_rows), bVar3) {
    other = __gnu_cxx::
            __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
            ::operator*(&__end0);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_a8,other);
    Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
              (&local_d0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_58,
               (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_a8);
    Eigen::Matrix<int,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
              ((Matrix<int,_1,1,0,_1,1> *)&local_b8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                *)&local_d0);
    iVar4 = (*(base->super_base_lattice<float>)._vptr_base_lattice[0x11])(base,&local_b8);
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_b8);
    if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
      Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)local_168,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_58,
                 (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_a8);
      Eigen::
      DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
      ::cast<double>(&local_150,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                      *)local_168);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                (&local_128,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)p,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_150);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>const>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_f0,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>_>_>
                  *)&local_128);
      dVar6 = tp_linear::phi<3>(h,&local_f0);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_f0);
      local_e0 = dVar6;
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        for (local_16c = 0; local_16c < 3; local_16c = local_16c + 1) {
          if (lattices[local_16c] != (cartesian_cubic<float> *)0x0) {
            pcVar2 = lattices[local_16c];
            Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                      (&local_198,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_58,
                       (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_a8);
            Eigen::Matrix<int,-1,1,0,-1,1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                      ((Matrix<int,_1,1,0,_1,1> *)&local_180,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                        *)&local_198);
            iVar4 = (*(pcVar2->super_base_lattice<float>)._vptr_base_lattice[0x14])
                              (pcVar2,&local_180);
            Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_180);
            dVar6 = local_e0;
            if ((((byte)iVar4 ^ 0xff) & 1) == 0) {
              pcVar2 = lattices[local_16c];
              Eigen::MatrixBase<Eigen::Matrix<int,-1,1,0,-1,1>>::operator+
                        (&local_1c0,(MatrixBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)local_58,
                         (MatrixBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)local_a8);
              Eigen::Matrix<int,-1,1,0,-1,1>::
              Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,int>,Eigen::Matrix<int,_1,1,0,_1,1>const,Eigen::Matrix<int,_1,1,0,_1,1>const>>
                        ((Matrix<int,_1,1,0,_1,1> *)&local_1a8,
                         (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<int,_int>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
                          *)&local_1c0);
              iVar4 = (*(pcVar2->super_base_lattice<float>)._vptr_base_lattice[5])
                                (pcVar2,&local_1a8);
              fVar1 = *(float *)CONCAT44(extraout_var,iVar4);
              pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                                 ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this
                                  ,(long)local_16c);
              *pSVar5 = dVar6 * (double)fVar1 + *pSVar5;
              Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_1a8);
            }
          }
        }
        w._4_4_ = 0;
      }
      else {
        w._4_4_ = 3;
      }
    }
    else {
      w._4_4_ = 3;
    }
    Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_a8);
    __gnu_cxx::
    __normal_iterator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_*,_std::vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>_>
    ::operator++(&__end0);
  }
  __range2._7_1_ = 1;
  w._4_4_ = 1;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_78);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)local_58);
  std::
  vector<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
             *)&c.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  vVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

static vector grad_convolution_sum_h(const vector &p, const L* base, const L **lattices, const double &h) {
            auto sites = BF::template get_integer_support<N>();
            lattice_site c = base->get_nearest_site(p);
            lattice_site extent = base->get_dimensions();

            vector value(N);
            value.setZero();

            for(lattice_site s : sites) {
                if(!base->is_lattice_site(c+s)) continue;

                double w = BF::template phi<N>(h, p - (c+s).cast<double>());

                if(w == 0.) continue;

                for(int j = 0; j < N; j++) {
                    if(lattices[j] == nullptr) continue;
                    if(!lattices[j]->is_filled(c+s)) continue;
                    value[j] += w * (double)(*lattices[j])(c + s);
                }
            }
            return value;
        }